

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<std::__cxx11::string_const,DenseStringSet>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>
::find_position<std::__cxx11::string>
          (sparse_hashtable<std::pair<std::__cxx11::string_const,DenseStringSet>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  long lVar1;
  bool bVar2;
  const_reference b;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  
  lVar1 = *(long *)(this + 0x80);
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  if (key->_M_string_length == 0) {
    uVar5 = 0;
  }
  else {
    sVar3 = 0;
    uVar5 = 0;
    do {
      uVar5 = (long)(key->_M_dataplus)._M_p[sVar3] + uVar5 * 0x21;
      sVar3 = sVar3 + 1;
    } while (key->_M_string_length != sVar3);
  }
  uVar8 = 0xffffffffffffffff;
  lVar6 = 0;
  do {
    uVar5 = uVar5 & lVar1 - 1U;
    lVar7 = (uVar5 / 0x30) * 0x10;
    uVar4 = uVar5 % 0x30;
    if ((*(byte *)((uVar4 >> 3) + 10 + *(long *)(this + 0x68) + lVar7) >> ((uint)uVar4 & 7) & 1) ==
        0) {
      uVar4 = uVar5;
      if (uVar8 != 0xffffffffffffffff) {
        uVar4 = uVar8;
      }
      uVar5 = 0xffffffffffffffff;
LAB_00a24817:
      pVar9.second = uVar4;
      pVar9.first = uVar5;
      return pVar9;
    }
    bVar2 = sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
            ::test_deleted((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
                            *)this,uVar5);
    if (bVar2) {
      if (uVar8 == 0xffffffffffffffff) {
        uVar8 = uVar5;
      }
    }
    else {
      b = sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
          ::unsafe_get((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
                        *)(lVar7 + *(long *)(this + 0x68)),(size_type_conflict)uVar4);
      bVar2 = Hasher::operator()((Hasher *)(this + 0x30),key,&b->first);
      if (bVar2) {
        uVar4 = 0xffffffffffffffff;
        goto LAB_00a24817;
      }
    }
    uVar5 = uVar5 + lVar6 + 1;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }